

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O0

FIOBJ fiobj_ary_new(void)

{
  FIOBJ FVar1;
  
  FVar1 = fiobj_ary_alloc(0);
  return FVar1;
}

Assistant:

FIOBJ fiobj_ary_new(void) { return fiobj_ary_alloc(0); }